

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_null_as_boolean(void)

{
  error_code eVar1;
  int local_70 [2];
  error_category *local_68;
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  std::error_code::error_code((error_code *)local_48);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_4b = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.value<bool>(error)","bool{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1475,"void value_suite::fail_null_as_boolean()",local_4a,&local_4b);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_68 = eVar1._M_cat;
  local_70[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1476,"void value_suite::fail_null_as_boolean()",local_48,local_70);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  return;
}

Assistant:

void fail_null_as_boolean()
{
    variable data;
    std::error_code error;
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<bool>(error), bool{});
    TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
}